

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O0

void __thiscall
llama_sbatch::from_batch
          (llama_sbatch *this,llama_batch *batch,size_t n_embd,bool simple_split,bool logits_all)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  byte in_CL;
  llama_seq_id *in_RDX;
  int *in_RSI;
  value_type *in_RDI;
  byte in_R8B;
  bool bVar6;
  llama_sbatch_seq new_seq;
  int32_t j;
  bool same;
  llama_seq_id *seq_ids;
  int32_t n_seqs;
  size_t bi;
  size_t i_1;
  llama_sbatch_seq *last_seq;
  llama_sbatch_seq *s;
  size_t i;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *in_stack_ffffffffffffff40;
  anon_class_8_1_a7acc65a in_stack_ffffffffffffff50;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_ffffffffffffff58;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_ffffffffffffff60;
  int local_78;
  ulong local_58;
  reference local_50;
  vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *local_28;
  
  if (*in_RSI < 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
               ,0xc1,"GGML_ASSERT(%s) failed","batch.n_tokens >= 0");
  }
  *(int **)(in_RDI + 3) = in_RSI;
  in_RDI->seq_id = in_RDX;
  *(byte *)&in_RDI->offset = in_R8B & 1;
  *(long *)in_RDI = (long)*in_RSI;
  std::vector<long,_std::allocator<long>_>::resize
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff60._M_current,
             (size_type)in_stack_ffffffffffffff58._M_current);
  std::vector<long,_std::allocator<long>_>::clear((vector<long,_std::allocator<long>_> *)0x3c4cf5);
  for (local_28 = (vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)0x0;
      local_28 < *(vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> **)in_RDI;
      local_28 = (vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)
                 ((long)&(local_28->
                         super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1)) {
    in_stack_ffffffffffffff40 = local_28;
    pvVar2 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)&in_RDI->length,(size_type)local_28);
    *pvVar2 = (value_type)in_stack_ffffffffffffff40;
  }
  if ((in_CL & 1) == 0) {
    std::vector<long,_std::allocator<long>_>::begin
              ((vector<long,_std::allocator<long>_> *)
               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    std::vector<long,_std::allocator<long>_>::end
              ((vector<long,_std::allocator<long>_> *)
               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    std::
    sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,llama_sbatch::from_batch(llama_batch_const&,unsigned_long,bool,bool)::__0>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    local_50 = (reference)0x0;
    for (local_58 = 0; local_58 < *(ulong *)in_RDI; local_58 = local_58 + 1) {
      pvVar2 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)&in_RDI->length,local_58);
      iVar1 = *(int *)(*(long *)(in_RSI + 8) + *pvVar2 * 4);
      if (local_50 == (reference)0x0) {
LAB_003c4f3e:
        std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::push_back
                  ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)
                   in_stack_ffffffffffffff50.batch,in_RDI);
        local_50 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::back
                             (in_stack_ffffffffffffff40);
      }
      else {
        bVar6 = iVar1 == local_50->n_seq_id;
        for (local_78 = 0; in_stack_ffffffffffffff3f = bVar6 && local_78 < iVar1,
            bVar6 && local_78 < iVar1; local_78 = local_78 + 1) {
          if (*(int *)(*(long *)(*(long *)(in_RSI + 10) + *pvVar2 * 8) + (long)local_78 * 4) !=
              local_50->seq_id[local_78]) {
            bVar6 = false;
          }
        }
        if (!bVar6) goto LAB_003c4f3e;
        local_50->length = local_50->length + 1;
      }
    }
    iVar4 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::begin
                      ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)
                       CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    iVar5 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::end
                      ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)
                       CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    std::
    sort<__gnu_cxx::__normal_iterator<llama_sbatch_seq*,std::vector<llama_sbatch_seq,std::allocator<llama_sbatch_seq>>>,llama_sbatch::from_batch(llama_batch_const&,unsigned_long,bool,bool)::__1>
              (iVar4._M_current,iVar5._M_current);
  }
  else {
    std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::resize
              ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)
               in_stack_ffffffffffffff60._M_current,(size_type)in_stack_ffffffffffffff58._M_current)
    ;
    pvVar3 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::operator[]
                       ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)
                        &in_RDI[2].seq_id,0);
    pvVar3->n_seq_id = 0;
    pvVar3->seq_id = (llama_seq_id *)0x0;
    pvVar3->offset = 0;
    pvVar3->length = *(ulong *)in_RDI;
  }
  return;
}

Assistant:

void llama_sbatch::from_batch(const llama_batch & batch, size_t n_embd, bool simple_split, bool logits_all) {
    GGML_ASSERT(batch.n_tokens >= 0);
    this->batch = &batch;
    this->n_embd = n_embd;
    this->logits_all = logits_all;

    n_tokens = batch.n_tokens;
    ids.resize(n_tokens);
    out_ids.clear();
    // TODO: reserve out_ids and seq

    for (size_t i = 0; i < n_tokens; ++i) {
        ids[i] = i;
    }
    if (simple_split) {
        seq.resize(1);
        llama_sbatch_seq & s = seq[0];
        s.n_seq_id = 0;
        s.seq_id = nullptr;
        s.offset = 0;
        s.length = n_tokens;
        return;
    }
    std::sort(ids.begin(), ids.end(),
            [&batch](size_t a, size_t b) {
                int32_t n_seq_a = batch.n_seq_id ? batch.n_seq_id[a] : 1;
                int32_t n_seq_b = batch.n_seq_id ? batch.n_seq_id[b] : 1;
                // sort by seq_id, then by pos
                if (n_seq_a == n_seq_b) {
                    if (batch.seq_id) {
                        for (int32_t i = 0; i < n_seq_a; ++i) {
                            llama_seq_id seq_id_a = batch.seq_id[a][i];
                            llama_seq_id seq_id_b = batch.seq_id[b][i];
                            // smaller seq_ids go first
                            if (seq_id_a != seq_id_b) {
                                return seq_id_a < seq_id_b;
                            }
                        }
                    }
                    // when all else is equal, sort by pos
                    if (batch.pos) {
                        return batch.pos[a] < batch.pos[b];
                    }
                    // no pos, sort by id
                    return a < b;
                }
                // shared prompts go first
                return n_seq_a > n_seq_b;
            }
    );
    // init seq
    llama_sbatch_seq * last_seq = nullptr;

    for (size_t i = 0; i < n_tokens; ++i) {
        const size_t bi = ids[i];
        const int32_t n_seqs = batch.n_seq_id[bi];
        llama_seq_id * seq_ids = batch.seq_id[bi];
        if (last_seq != nullptr) {
            bool same = n_seqs == last_seq->n_seq_id;
            for (int32_t j = 0; same && j < n_seqs; ++j) {
                if (seq_ids[j] != last_seq->seq_id[j]) {
                    same = false;
                }
            }
            if (same) {
                last_seq->length += 1;
                continue;
            }
        }
        llama_sbatch_seq new_seq = {n_seqs, seq_ids, i, 1};
        seq.push_back(new_seq);
        last_seq = &seq.back();
    }
    // keep shared prompts first at the end, then sort by length descending.
    std::sort(seq.begin(), seq.end(),
            [](llama_sbatch_seq & a, llama_sbatch_seq & b) {
                if (a.n_seq_id == b.n_seq_id) {
                    return a.length > b.length;
                }
                return a.n_seq_id < b.n_seq_id;
            }
            );
}